

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O3

LArYieldResult * __thiscall
NEST::LArNEST::GetYields
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,LArInteraction species,double energy
          ,double dx,double efield,double density)

{
  double dVar1;
  double ionization_yields;
  
  switch(species) {
  case NR:
    GetNRYields(__return_storage_ptr__,this,energy,efield,efield);
    break;
  case ER:
    GetERYields(__return_storage_ptr__,this,energy,efield,density);
    break;
  case Alpha:
    GetAlphaYields(__return_storage_ptr__,this,energy,efield,efield);
    break;
  default:
    dVar1 = GetCanonicalIonizationYields(this,energy);
    ionization_yields = 0.0;
    if (0.0 <= dVar1) {
      ionization_yields = dVar1;
    }
    GetdEdxRecombinationYields
              (__return_storage_ptr__,this,ionization_yields,this->fNexOverNion * ionization_yields,
               energy,dx,efield);
    break;
  case LeptonLET:
    GetLeptonLETYields(__return_storage_ptr__,this,energy,dx,efield,density);
    break;
  case LET:
    GetLETYields(__return_storage_ptr__,this,energy,dx,efield,density);
  }
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::GetYields(LArInteraction species, double energy,
                                  double dx, double efield, double density) {
  if (species == LArInteraction::NR) {
    return GetNRYields(energy, efield, density);
  } else if (species == LArInteraction::ER) {
    return GetERYields(energy, efield, density);
  } else if (species == LArInteraction::Alpha) {
    return GetAlphaYields(energy, efield, density);
  } else if (species == LArInteraction::LeptonLET) {
    return GetLeptonLETYields(energy, dx, efield, density);
  } else if (species == LArInteraction::LET) {
    return GetLETYields(energy, dx, efield, density);
  } else {
    return GetdEdxYields(energy, dx, efield, density);
  }
}